

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O2

bool __thiscall QFileSystemEntry::isAbsolute(QFileSystemEntry *this)

{
  bool bVar1;
  
  resolveFilePath(this);
  if ((this->m_filePath).d.size == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = *(this->m_filePath).d.ptr == L'/';
  }
  return bVar1;
}

Assistant:

bool QFileSystemEntry::isAbsolute() const
{
    resolveFilePath();
    return (!m_filePath.isEmpty() && (m_filePath.at(0).unicode() == '/'));
}